

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Imputer::clear_ReplaceValue(Imputer *this)

{
  ReplaceValueCase RVar1;
  string *default_value;
  Imputer *this_local;
  
  RVar1 = ReplaceValue_case(this);
  switch(RVar1) {
  case REPLACEVALUE_NOT_SET:
    break;
  case kReplaceDoubleValue:
    break;
  case kReplaceInt64Value:
    break;
  case kReplaceStringValue:
    default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::DestroyNoArena
              (&(this->ReplaceValue_).replacestringvalue_,default_value);
  }
  this->_oneof_case_[1] = 0;
  return;
}

Assistant:

void Imputer::clear_ReplaceValue() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.Imputer)
  switch (ReplaceValue_case()) {
    case kReplaceDoubleValue: {
      // No need to clear
      break;
    }
    case kReplaceInt64Value: {
      // No need to clear
      break;
    }
    case kReplaceStringValue: {
      ReplaceValue_.replacestringvalue_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
      break;
    }
    case REPLACEVALUE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[1] = REPLACEVALUE_NOT_SET;
}